

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O0

size_t __thiscall
RVO::RVOSimulator::addAgent
          (RVOSimulator *this,Vector2 *position,float neighborDist,size_t maxNeighbors,
          float timeHorizon,float timeHorizonObst,float radius,float maxSpeed,Vector2 *velocity)

{
  value_type *__x;
  value_type pAVar1;
  size_type sVar2;
  undefined8 *in_RCX;
  value_type in_RDX;
  undefined8 *in_RSI;
  vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  Agent *agent;
  vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *in_stack_ffffffffffffffb0;
  Agent *in_stack_ffffffffffffffc0;
  value_type *ppAVar3;
  
  __x = (value_type *)operator_new(0x90);
  Agent::Agent(in_stack_ffffffffffffffc0);
  __x[10] = (value_type)*in_RSI;
  __x[0xc] = (value_type)*in_RCX;
  ppAVar3 = __x;
  pAVar1 = (value_type)std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(in_RDI);
  ppAVar3[0xd] = pAVar1;
  ppAVar3[0xe] = in_RDX;
  *(undefined4 *)(ppAVar3 + 0xf) = in_XMM4_Da;
  *(undefined4 *)((long)ppAVar3 + 0x7c) = in_XMM0_Da;
  *(undefined4 *)(ppAVar3 + 0x10) = in_XMM3_Da;
  *(undefined4 *)((long)ppAVar3 + 0x84) = in_XMM1_Da;
  *(undefined4 *)(ppAVar3 + 0x11) = in_XMM2_Da;
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::push_back(in_stack_ffffffffffffffb0,__x)
  ;
  sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(in_RDI);
  return sVar2 - 1;
}

Assistant:

std::size_t RVOSimulator::addAgent(const Vector2 &position, float neighborDist,
                                   std::size_t maxNeighbors, float timeHorizon,
                                   float timeHorizonObst, float radius,
                                   float maxSpeed, const Vector2 &velocity) {
  Agent *const agent = new Agent();
  agent->position_ = position;
  agent->velocity_ = velocity;
  agent->id_ = agents_.size();
  agent->maxNeighbors_ = maxNeighbors;
  agent->maxSpeed_ = maxSpeed;
  agent->neighborDist_ = neighborDist;
  agent->radius_ = radius;
  agent->timeHorizon_ = timeHorizon;
  agent->timeHorizonObst_ = timeHorizonObst;
  agents_.push_back(agent);

  return agents_.size() - 1U;
}